

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractproxymodel.cpp
# Opt level: O0

QVariant * __thiscall
QAbstractProxyModel::headerData
          (QAbstractProxyModel *this,int section,Orientation orientation,int role)

{
  int iVar1;
  arrow_operator_result ppQVar2;
  uint in_ECX;
  uint in_EDX;
  long *in_RSI;
  QVariant *in_RDI;
  uint in_R8D;
  long in_FS_OFFSET;
  int sourceSection;
  QAbstractProxyModelPrivate *d;
  QModelIndex proxyIndex_1;
  QModelIndex proxyIndex;
  QVariant *this_00;
  uint local_f4;
  QModelIndex local_c8;
  undefined1 local_b0 [24];
  undefined1 *local_98;
  undefined1 *local_90;
  undefined1 *local_88;
  undefined1 local_80 [24];
  QModelIndex local_68;
  undefined1 local_50 [24];
  undefined1 *local_38;
  undefined1 *local_30;
  undefined1 *local_28;
  undefined1 local_20 [24];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  d_func((QAbstractProxyModel *)0x852f0f);
  local_f4 = in_EDX;
  if (in_ECX == 1) {
    QModelIndex::QModelIndex((QModelIndex *)0x852f34);
    iVar1 = (**(code **)(*in_RSI + 0x78))(in_RSI,local_20);
    if (0 < iVar1) {
      local_38 = &DAT_aaaaaaaaaaaaaaaa;
      local_30 = &DAT_aaaaaaaaaaaaaaaa;
      local_28 = &DAT_aaaaaaaaaaaaaaaa;
      QModelIndex::QModelIndex((QModelIndex *)0x852f92);
      (**(code **)(*in_RSI + 0x60))(&local_38,in_RSI,0,in_EDX,local_50);
      (**(code **)(*in_RSI + 400))(&local_68,in_RSI,&local_38);
      local_f4 = QModelIndex::column(&local_68);
    }
  }
  else {
    QModelIndex::QModelIndex((QModelIndex *)0x852ff4);
    iVar1 = (**(code **)(*in_RSI + 0x80))(in_RSI,local_80);
    if (0 < iVar1) {
      local_98 = &DAT_aaaaaaaaaaaaaaaa;
      local_90 = &DAT_aaaaaaaaaaaaaaaa;
      local_88 = &DAT_aaaaaaaaaaaaaaaa;
      QModelIndex::QModelIndex((QModelIndex *)0x853051);
      (**(code **)(*in_RSI + 0x60))(&local_98,in_RSI,in_EDX,0,local_b0);
      (**(code **)(*in_RSI + 400))(&local_c8,in_RSI,&local_98);
      local_f4 = QModelIndex::row(&local_c8);
    }
  }
  ppQVar2 = QObjectCompatProperty<QAbstractProxyModelPrivate,_QAbstractItemModel_*,_&QAbstractProxyModelPrivate::_qt_property_model_offset,_&QAbstractProxyModelPrivate::setModelForwarder,_&QAbstractProxyModelPrivate::modelChangedForwarder,_&QAbstractProxyModelPrivate::getModelForwarder>
            ::operator->((QObjectCompatProperty<QAbstractProxyModelPrivate,_QAbstractItemModel_*,_&QAbstractProxyModelPrivate::_qt_property_model_offset,_&QAbstractProxyModelPrivate::setModelForwarder,_&QAbstractProxyModelPrivate::modelChangedForwarder,_&QAbstractProxyModelPrivate::getModelForwarder>
                          *)this_00);
  (*((*ppQVar2)->super_QObject)._vptr_QObject[0x14])
            (this_00,*ppQVar2,(ulong)local_f4,(ulong)in_ECX,(ulong)in_R8D);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

QVariant QAbstractProxyModel::headerData(int section, Qt::Orientation orientation, int role) const
{
    Q_D(const QAbstractProxyModel);
    int sourceSection = section;
    if (orientation == Qt::Horizontal) {
        if (rowCount() > 0) {
            const QModelIndex proxyIndex = index(0, section);
            sourceSection = mapToSource(proxyIndex).column();
        }
    } else {
        if (columnCount() > 0) {
            const QModelIndex proxyIndex = index(section, 0);
            sourceSection = mapToSource(proxyIndex).row();
        }
    }
    return d->model->headerData(sourceSection, orientation, role);
}